

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

bill_x * onbill(obj *obj,monst *shkp,boolean silent)

{
  short sVar1;
  int iVar2;
  bill_x *pbVar3;
  char *line;
  
  if ((shkp != (monst *)0x0) &&
     (sVar1 = *(short *)((long)&shkp[0x1b].misc_worn_check + 2), 0 < sVar1)) {
    pbVar3 = *(bill_x **)&shkp[0x1b].mnum;
    iVar2 = sVar1 + 1;
    do {
      if (pbVar3->bo_id == obj->o_id) {
        if ((obj->field_0x4a & 4) != 0) {
          return pbVar3;
        }
        line = "onbill: paid obj on bill?";
        goto LAB_0023b270;
      }
      pbVar3 = pbVar3 + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  pbVar3 = (bill_x *)0x0;
  if ((silent == '\0') && ((*(uint *)&obj->field_0x4a & 4) != 0)) {
    line = "onbill: unpaid obj not on bill?";
LAB_0023b270:
    pline(line);
  }
  return pbVar3;
}

Assistant:

static struct bill_x *onbill(const struct obj *obj, struct monst *shkp, boolean silent)
{
	if (shkp) {
		struct bill_x *bp = ESHK(shkp)->bill_p;
		int ct = ESHK(shkp)->billct;

		while (--ct >= 0)
		    if (bp->bo_id == obj->o_id) {
			if (!obj->unpaid) pline("onbill: paid obj on bill?");
			return bp;
		    } else bp++;
	}
	if (obj->unpaid && !silent) pline("onbill: unpaid obj not on bill?");
	return NULL;
}